

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall cs222::Parser::Parser(Parser *this,istream *inputStream)

{
  runtime_error *this_00;
  
  this->_vptr_Parser = (_func_int **)&PTR_next_001436e0;
  this->inputStream = inputStream;
  this->lineNumber = 0;
  (this->line)._M_dataplus._M_p = (pointer)&(this->line).field_2;
  (this->line)._M_string_length = 0;
  (this->line).field_2._M_local_buf[0] = '\0';
  (this->flags).super__Base_bitset<1UL>._M_w = 0;
  (this->nextInstruction)._M_t.
  super___uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>.
  super__Head_base<0UL,_cs222::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
  if (((byte)inputStream[*(long *)(*(long *)inputStream + -0x18) + 0x20] & 5) == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Parser: malformed input stream");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Parser::Parser(std::istream& inputStream) :
        inputStream(inputStream), lineNumber(0)
    {
        if (!inputStream)
        {
            throw std::runtime_error("Parser: malformed input stream");
        }
    }